

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O0

Args * CreateArgs(TrainingArgs args,AutotuneArgs autotuneArgs,char *label,char *pretrainedVectors)

{
  long in_RDX;
  long in_RSI;
  Args *in_RDI;
  Args *result;
  char *local_d8;
  char *pcVar1;
  char *local_c8;
  Args *__a;
  long *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  Args *in_stack_ffffffffffffff80;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [39];
  undefined1 local_19;
  long local_18;
  long local_10;
  
  __s = (long *)&stack0x00000070;
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stack0x00000008;
  local_19 = 0;
  __a = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  fasttext::Args::Args(in_stack_ffffffffffffff80);
  in_RDI->lr = *(double *)this;
  in_RDI->lrUpdateRate = (int)this->_M_string_length;
  in_RDI->dim = *(int *)((long)&this->_M_string_length + 4);
  in_RDI->ws = *(int *)&this->field_2;
  in_RDI->epoch = *(int *)((long)&this->field_2 + 4);
  in_RDI->minCount = *(int *)((long)&this->field_2 + 8);
  in_RDI->minCountLabel = *(int *)((long)&this->field_2 + 0xc);
  in_RDI->neg = *(int *)(this + 1);
  in_RDI->wordNgrams = *(int *)&this[1].field_0x4;
  in_RDI->loss = (loss_name)this[1]._M_string_length;
  in_RDI->model = *(model_name *)((long)&this[1]._M_string_length + 4);
  in_RDI->bucket = *(int *)&this[1].field_2;
  in_RDI->minn = *(int *)((long)&this[1].field_2 + 4);
  in_RDI->maxn = *(int *)((long)&this[1].field_2 + 8);
  in_RDI->thread = *(int *)((long)&this[1].field_2 + 0xc);
  in_RDI->t = *(double *)(this + 2);
  if (local_10 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)__a);
    std::__cxx11::string::operator=((string *)&in_RDI->label,local_40);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  in_RDI->verbose = (int)this[2]._M_string_length;
  if (local_18 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)__a);
    std::__cxx11::string::operator=((string *)&in_RDI->pretrainedVectors,local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
  }
  in_RDI->saveOutput = (bool)(*(byte *)((long)&this[2]._M_string_length + 4) & 1);
  in_RDI->seed = *(int *)((long)&this[2]._M_string_length + 5);
  in_RDI->qout = (bool)(this[2].field_2._M_local_buf[1] & 1);
  in_RDI->retrain = (bool)(this[2].field_2._M_local_buf[2] & 1);
  in_RDI->qnorm = (bool)(this[2].field_2._M_local_buf[3] & 1);
  in_RDI->cutoff = *(size_t *)((long)&this[2].field_2 + 4);
  in_RDI->dsub = *(size_t *)((long)&this[2].field_2 + 0xc);
  if (*__s == 0) {
    local_c8 = "";
  }
  else {
    local_c8 = (char *)*__s;
  }
  std::__cxx11::string::operator=((string *)&in_RDI->autotuneValidationFile,local_c8);
  in_RDI->autotuneDuration = *(int *)((long)__s + 0x14);
  if (__s[1] == 0) {
    pcVar1 = "f1";
  }
  else {
    pcVar1 = (char *)__s[1];
  }
  std::__cxx11::string::operator=((string *)&in_RDI->autotuneMetric,pcVar1);
  if (__s[3] == 0) {
    local_d8 = "";
  }
  else {
    local_d8 = (char *)__s[3];
  }
  std::__cxx11::string::operator=((string *)&in_RDI->autotuneModelSize,local_d8);
  in_RDI->autotunePredictions = (int)__s[2];
  in_RDI->autotuneVerbose = (int)__s[4];
  return __a;
}

Assistant:

fasttext::Args CreateArgs(TrainingArgs args, AutotuneArgs autotuneArgs, const char* label, const char* pretrainedVectors)
{
    auto result = fasttext::Args();

    result.lr = args.lr;
    result.lrUpdateRate = args.lrUpdateRate;
    result.dim = args.dim;
    result.ws = args.ws;
    result.epoch = args.epoch;
    result.minCount = args.minCount;
    result.minCountLabel = args.minCountLabel;
    result.neg = args.neg;
    result.wordNgrams = args.wordNgrams;
    result.loss = args.loss;
    result.model = args.model;
    result.bucket = args.bucket;
    result.minn = args.minn;
    result.maxn = args.maxn;
    result.thread = args.thread;
    result.t = args.t;

    if (label != nullptr)
    {
        result.label = std::string(label);
    }

    result.verbose = args.verbose;

    if (pretrainedVectors != nullptr)
    {
        result.pretrainedVectors = std::string(pretrainedVectors);
    }

    result.saveOutput = args.saveOutput;
    result.seed = args.seed;

    result.qout = args.qout;
    result.retrain = args.retrain;
    result.qnorm = args.qnorm;
    result.cutoff = args.cutoff;
    result.dsub = args.dsub;

    // Autotune
    result.autotuneValidationFile = autotuneArgs.validationFile == nullptr ? "" : autotuneArgs.validationFile;
    result.autotuneDuration = autotuneArgs.duration;
    result.autotuneMetric = autotuneArgs.metric == nullptr ? "f1" : autotuneArgs.metric;
    result.autotuneModelSize = autotuneArgs.modelSize == nullptr ? "" : autotuneArgs.modelSize;
    result.autotunePredictions = autotuneArgs.predictions;
    result.autotuneVerbose = autotuneArgs.verbose;

    return result;
}